

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMessenger.cxx
# Opt level: O3

bool __thiscall cmMessenger::IsMessageTypeVisible(cmMessenger *this,MessageType t)

{
  bool bVar1;
  
  bVar1 = true;
  switch(t) {
  case AUTHOR_WARNING:
    bVar1 = GetSuppressDevWarnings(this);
    break;
  case AUTHOR_ERROR:
    bVar1 = GetDevWarningsAsErrors(this);
    return bVar1;
  default:
    goto switchD_0042050c_caseD_2;
  case DEPRECATION_ERROR:
    bVar1 = GetDeprecatedWarningsAsErrors(this);
    return bVar1;
  case DEPRECATION_WARNING:
    bVar1 = GetSuppressDeprecatedWarnings(this);
  }
  bVar1 = (bool)(bVar1 ^ 1);
switchD_0042050c_caseD_2:
  return bVar1;
}

Assistant:

bool cmMessenger::IsMessageTypeVisible(cmake::MessageType t) const
{
  bool isVisible = true;

  if (t == cmake::DEPRECATION_ERROR) {
    if (!this->GetDeprecatedWarningsAsErrors()) {
      isVisible = false;
    }
  } else if (t == cmake::DEPRECATION_WARNING) {
    if (this->GetSuppressDeprecatedWarnings()) {
      isVisible = false;
    }
  } else if (t == cmake::AUTHOR_ERROR) {
    if (!this->GetDevWarningsAsErrors()) {
      isVisible = false;
    }
  } else if (t == cmake::AUTHOR_WARNING) {
    if (this->GetSuppressDevWarnings()) {
      isVisible = false;
    }
  }

  return isVisible;
}